

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_logo.c
# Opt level: O0

void render(void)

{
  float fVar1;
  ALLEGRO_BITMAP *pAVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 in_XMM2_Db;
  ALLEGRO_COLOR c_1;
  float f;
  int j;
  int i;
  ALLEGRO_STATE state;
  float a;
  float b;
  float g;
  float r;
  ALLEGRO_COLOR c;
  int bottom;
  int right;
  int top;
  int left;
  int y;
  int x;
  ALLEGRO_BITMAP *crop;
  ALLEGRO_BITMAP *fulllogo;
  ALLEGRO_BITMAP *fullflash;
  double t;
  int local_460;
  int local_45c;
  undefined1 local_458 [1024];
  float local_58;
  undefined1 local_54 [4];
  undefined1 local_50 [4];
  undefined1 local_4c [4];
  undefined8 local_48;
  ulong local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 local_20;
  ALLEGRO_BITMAP *local_18;
  undefined8 local_10;
  double local_8;
  
  local_8 = (double)al_get_time();
  if ((regenerate & 1U) != 0) {
    al_destroy_bitmap(logo);
    al_destroy_bitmap(logo_flash);
    logo = (ALLEGRO_BITMAP *)0x0;
    regenerate = false;
  }
  if (logo == (ALLEGRO_BITMAP *)0x0) {
    strtol(param_values[2],(char **)0x0,10);
    strtod(param_values[3],(char **)0x0);
    dVar3 = strtod(param_values[4],(char **)0x0);
    strtod(param_values[5],(char **)0x0);
    strtod(param_values[6],(char **)0x0);
    strtod(param_values[7],(char **)0x0);
    strtod(param_values[8],(char **)0x0);
    uVar6 = (ulong)(uint)(float)dVar3;
    in_XMM2_Db = 0;
    local_18 = generate_logo((char *)state._tls._96_8_,(char *)state._tls._88_8_,state._tls._84_4_,
                             (float)state._tls._80_4_,(float)state._tls._76_4_,
                             (float)state._tls._72_4_,(float)state._tls._68_4_,
                             (float)state._tls._64_4_,(float)state._tls._60_4_,
                             (ALLEGRO_BITMAP **)state._tls._48_8_);
    local_2c = 0x280;
    local_30 = 0x1e0;
    local_34 = -1;
    local_38 = -1;
    al_lock_bitmap(local_18,0,1);
    for (local_28 = 0; local_28 < 0x1e0; local_28 = local_28 + 1) {
      for (local_24 = 0; local_24 < 0x280; local_24 = local_24 + 1) {
        local_48 = al_get_pixel(local_18,local_24,local_28);
        local_40 = uVar6;
        al_unmap_rgba_f(local_48,local_4c,local_50,local_54,&local_58);
        uVar6 = 0;
        if (0.0 < local_58) {
          if (local_24 < local_2c) {
            local_2c = local_24;
          }
          if (local_28 < local_30) {
            local_30 = local_28;
          }
          if (local_34 < local_24) {
            local_34 = local_24;
          }
          if (local_38 < local_28) {
            local_38 = local_28;
          }
        }
      }
    }
    al_unlock_bitmap(local_18);
    if (local_2c == 0x280) {
      local_2c = 0;
    }
    if (local_30 == 0x1e0) {
      local_30 = 0;
    }
    if (local_34 < local_2c) {
      local_34 = local_2c;
    }
    if (local_38 < local_30) {
      local_38 = local_30;
    }
    local_20 = al_create_sub_bitmap
                         (local_18,local_2c,local_30,(local_34 + 1) - local_2c,
                          (local_38 + 1) - local_30);
    logo = (ALLEGRO_BITMAP *)al_clone_bitmap(local_20);
    al_destroy_bitmap(local_20);
    al_destroy_bitmap(local_18);
    local_20 = al_create_sub_bitmap
                         (local_10,local_2c,local_30,(local_34 + 1) - local_2c,
                          (local_38 + 1) - local_30);
    logo_flash = (ALLEGRO_BITMAP *)al_clone_bitmap(local_20);
    al_destroy_bitmap(local_20);
    al_destroy_bitmap(local_10);
    logo_x = local_2c;
    logo_y = local_30;
    anim = local_8;
  }
  draw_background();
  if (0.5 <= local_8 - anim) {
    al_draw_bitmap(CONCAT44(0x3fe00000,(float)logo_x),
                   CONCAT44((int)((ulong)(local_8 - anim) >> 0x20),(float)logo_y),logo,0);
  }
  else {
    dVar3 = sin(((local_8 - anim) + (local_8 - anim)) * 3.141592653589793);
    fVar1 = (float)dVar3 * 0.3;
    uVar7 = CONCAT44(in_XMM2_Db,fVar1);
    uVar4 = al_map_rgb_f(CONCAT44(in_XMM2_Db,fVar1));
    al_store_state(local_458,0x10);
    al_set_blender(0,1,3);
    pAVar2 = logo;
    uVar8 = 0x3f800000;
    uVar5 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,1.0 - (float)dVar3);
    al_draw_tinted_bitmap(uVar5,uVar8,(float)logo_x,(float)logo_y,pAVar2,0);
    al_set_blender(0,1);
    for (local_460 = -2; local_460 < 3; local_460 = local_460 + 2) {
      for (local_45c = -2; local_45c < 3; local_45c = local_45c + 2) {
        al_draw_tinted_bitmap
                  (uVar4,uVar7,(float)(logo_x + local_45c),(float)(logo_y + local_460),logo_flash,0)
        ;
      }
    }
    al_restore_state(local_458);
  }
  print_parameters();
  return;
}

Assistant:

static void render(void)
{
   double t = al_get_time();
   if (regenerate) {
      al_destroy_bitmap(logo);
      al_destroy_bitmap(logo_flash);
      logo = NULL;
      regenerate = false;
   }
   if (!logo) {
      /* Generate a new logo. */
      ALLEGRO_BITMAP *fullflash;
      ALLEGRO_BITMAP *fulllogo = generate_logo(param_values[0],
         param_values[1],
         strtol(param_values[2], NULL, 10),
         strtod(param_values[3], NULL),
         strtod(param_values[4], NULL),
         strtod(param_values[5], NULL),
         strtod(param_values[6], NULL),
         strtod(param_values[7], NULL),
         strtod(param_values[8], NULL),
         &fullflash);
      ALLEGRO_BITMAP *crop;
      int x, y, left = 640, top = 480, right = -1, bottom = -1;
      /* Crop out the non-transparent part. */
      al_lock_bitmap(fulllogo, ALLEGRO_PIXEL_FORMAT_ANY, ALLEGRO_LOCK_READONLY);
      for (y = 0; y < 480; y++) {
         for (x = 0; x < 640; x++) {
            ALLEGRO_COLOR c = al_get_pixel(fulllogo, x, y);
            float r, g, b, a;
            al_unmap_rgba_f(c, &r, &g, &b, &a);
            if (a > 0) {
               if (x < left)
                  left = x;
               if (y < top)
                  top = y;
               if (x > right)
                  right = x;
               if (y > bottom)
                  bottom = y;
            }
         }
      }
      al_unlock_bitmap(fulllogo);

      if (left == 640)
         left = 0;
      if (top == 480)
         top = 0;
      if (right < left)
         right = left;
      if (bottom < top)
         bottom = top;

      crop = al_create_sub_bitmap(fulllogo, left, top,
                                  1 + right - left, 1 + bottom - top);
      logo = al_clone_bitmap(crop);
      al_destroy_bitmap(crop);
      al_destroy_bitmap(fulllogo);

      crop = al_create_sub_bitmap(fullflash, left, top,
                                  1 + right - left, 1 + bottom - top);
      logo_flash = al_clone_bitmap(crop);
      al_destroy_bitmap(crop);
      al_destroy_bitmap(fullflash);

      logo_x = left;
      logo_y = top;

      anim = t;
   }
   draw_background();

   /* For half a second, display our flash animation. */
   if (t - anim < 0.5) {
      ALLEGRO_STATE state;
      int i, j;
      float f = sin(ALLEGRO_PI * ((t - anim) / 0.5));
      ALLEGRO_COLOR c = al_map_rgb_f(f * 0.3, f * 0.3, f * 0.3);
      al_store_state(&state, ALLEGRO_STATE_BLENDER);
      al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
      al_draw_tinted_bitmap(logo, al_map_rgba_f(1, 1, 1, 1 - f), logo_x, logo_y, 0);
      al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ONE);
      for (j = -2; j <= 2; j += 2) {
         for (i = -2; i <= 2; i += 2) {
            al_draw_tinted_bitmap(logo_flash, c, logo_x + i, logo_y + j, 0);
         }
      }
      al_restore_state(&state);
   }
   else
      al_draw_bitmap(logo, logo_x, logo_y, 0);


   print_parameters();
}